

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_create.cpp
# Opt level: O0

bool CreateHddImage(string *path,int nSizeMB_)

{
  bool bVar1;
  exception *this;
  element_type *this_00;
  element_type *peVar2;
  char *__name;
  long local_48;
  undefined1 local_40 [8];
  shared_ptr<HDD> hdd;
  int64_t total_size;
  bool f;
  int nSizeMB__local;
  string *path_local;
  
  total_size._3_1_ = false;
  if (opt.sectors == -1) {
    local_48 = (long)nSizeMB_ << 0x14;
  }
  else {
    local_48 = opt.sectors << 9;
  }
  if (0x3fffff < local_48) {
    HDD::CreateDisk((HDD *)local_40,path,local_48,(IDENTIFYDEVICE *)0x0,false);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_40);
    if (bVar1) {
      this_00 = std::__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                          ((__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                           local_40);
      peVar2 = std::__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_40);
      total_size._3_1_ = HDD::Copy(this_00,(HDD *)0x0,peVar2->total_sectors,0,0,0,"Creating");
      if (!total_size._3_1_) {
        __name = (char *)std::__cxx11::string::c_str();
        unlink(__name);
      }
    }
    else {
      Error("create");
    }
    std::shared_ptr<HDD>::~shared_ptr((shared_ptr<HDD> *)local_40);
    return total_size._3_1_;
  }
  this = (exception *)__cxa_allocate_exception(0x10);
  util::exception::exception<char_const(&)[53]>
            (this,(char (*) [53])"needs image size in MB (>=4) or sector count with -s");
  __cxa_throw(this,&util::exception::typeinfo,util::exception::~exception);
}

Assistant:

bool CreateHddImage(const std::string& path, int nSizeMB_)
{
    bool f = false;

    // If no sector count is specified, use the size parameter
    auto total_size = (opt.sectors == -1) ?
        static_cast<int64_t>(nSizeMB_) << 20 :
        static_cast<int64_t>(opt.sectors) << 9;

    if (total_size < 4 * 1024 * 1024)
        throw util::exception("needs image size in MB (>=4) or sector count with -s");

    // Create the specified HDD image, ensuring we don't overwrite any existing file
    auto hdd = HDD::CreateDisk(path, total_size, nullptr, false);
    if (!hdd)
        Error("create");
    else
    {
        // Zero-fill up to the required sector count
        f = hdd->Copy(nullptr, hdd->total_sectors, 0, 0, 0, "Creating");

        // If anything went wrong, remove the new file
        if (!f)
            unlink(path.c_str());
    }

    return f;
}